

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void tinyexr::ConvertHeader(EXRHeader *exr_header,HeaderInfo *info)

{
  long lVar1;
  size_type sVar2;
  void *pvVar3;
  char *__src;
  const_reference pvVar4;
  const_reference pvVar5;
  vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *in_RSI;
  undefined4 *in_RDI;
  size_t i;
  size_t c_2;
  size_t c_1;
  size_t c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  ulong local_18;
  
  *in_RDI = *(undefined4 *)
             &in_RSI[4].
              super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
  in_RDI[10] = *(undefined4 *)
                ((long)&in_RSI[3].
                        super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 4);
  in_RDI[0xb] = *(undefined4 *)
                 &in_RSI[3].
                  super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
  in_RDI[0xc] = *(undefined4 *)
                 ((long)&in_RSI[3].
                         super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  in_RDI[0xd] = *(undefined4 *)
                 ((long)&in_RSI[4].
                         super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start + 4);
  in_RDI[6] = *(undefined4 *)
               ((long)&in_RSI[2].
                       super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  in_RDI[7] = *(undefined4 *)
               &in_RSI[3].
                super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
                _M_impl.super__Vector_impl_data._M_start;
  in_RDI[8] = *(undefined4 *)
               ((long)&in_RSI[3].
                       super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start + 4);
  in_RDI[9] = *(undefined4 *)
               &in_RSI[3].
                super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  in_RDI[2] = *(undefined4 *)
               &in_RSI[2].
                super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
                _M_impl.super__Vector_impl_data._M_start;
  in_RDI[3] = *(undefined4 *)
               ((long)&in_RSI[2].
                       super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start + 4);
  in_RDI[4] = *(undefined4 *)
               &in_RSI[2].
                super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  in_RDI[5] = *(undefined4 *)
               ((long)&in_RSI[2].
                       super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 4);
  in_RDI[1] = *(undefined4 *)
               &in_RSI[2].
                super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  in_RDI[0x1f] = *(undefined4 *)
                  ((long)&in_RSI[5].
                          super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4);
  in_RDI[0xf] = *(undefined4 *)
                 &in_RSI[4].
                  super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
  in_RDI[0x10] = *(undefined4 *)
                  ((long)&in_RSI[4].
                          super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 4);
  in_RDI[0x11] = *(undefined4 *)
                  &in_RSI[4].
                   super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
  in_RDI[0x12] = *(undefined4 *)
                  ((long)&in_RSI[4].
                          super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  sVar2 = std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::size(in_RSI);
  in_RDI[0x1e] = (int)sVar2;
  pvVar3 = malloc((long)(int)in_RDI[0x1e] * 0x110);
  *(void **)(in_RDI + 0x1a) = pvVar3;
  for (local_18 = 0; local_18 < (ulong)(long)(int)in_RDI[0x1e]; local_18 = local_18 + 1) {
    lVar1 = *(long *)(in_RDI + 0x1a);
    std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::operator[]
              (in_RSI,local_18);
    __src = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                      (in_stack_ffffffffffffffb0);
    strncpy((char *)(lVar1 + local_18 * 0x110),__src,0xff);
    *(undefined1 *)(*(long *)(in_RDI + 0x1a) + local_18 * 0x110 + 0xff) = 0;
    pvVar4 = std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::operator[]
                       (in_RSI,local_18);
    *(int *)(*(long *)(in_RDI + 0x1a) + local_18 * 0x110 + 0x100) = pvVar4->pixel_type;
    pvVar4 = std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::operator[]
                       (in_RSI,local_18);
    *(uchar *)(*(long *)(in_RDI + 0x1a) + local_18 * 0x110 + 0x10c) = pvVar4->p_linear;
    pvVar4 = std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::operator[]
                       (in_RSI,local_18);
    *(int *)(*(long *)(in_RDI + 0x1a) + local_18 * 0x110 + 0x104) = pvVar4->x_sampling;
    pvVar4 = std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::operator[]
                       (in_RSI,local_18);
    *(int *)(*(long *)(in_RDI + 0x1a) + local_18 * 0x110 + 0x108) = pvVar4->y_sampling;
  }
  pvVar3 = malloc((long)(int)in_RDI[0x1e] << 2);
  *(void **)(in_RDI + 0x1c) = pvVar3;
  for (local_20 = 0; local_20 < (ulong)(long)(int)in_RDI[0x1e]; local_20 = local_20 + 1) {
    pvVar4 = std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::operator[]
                       (in_RSI,local_20);
    *(int *)(*(long *)(in_RDI + 0x1c) + local_20 * 4) = pvVar4->pixel_type;
  }
  pvVar3 = malloc((long)(int)in_RDI[0x1e] << 2);
  *(void **)(in_RDI + 0x20) = pvVar3;
  for (local_28 = 0; local_28 < (ulong)(long)(int)in_RDI[0x1e]; local_28 = local_28 + 1) {
    pvVar4 = std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::operator[]
                       (in_RSI,local_28);
    *(int *)(*(long *)(in_RDI + 0x20) + local_28 * 4) = pvVar4->pixel_type;
  }
  sVar2 = std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::size
                    ((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)(in_RSI + 1));
  in_RDI[0x17] = (int)sVar2;
  if ((int)in_RDI[0x17] < 1) {
    *(undefined8 *)(in_RDI + 0x18) = 0;
  }
  else {
    if (0x80 < (int)in_RDI[0x17]) {
      in_RDI[0x17] = 0x80;
    }
    pvVar3 = malloc((long)(int)in_RDI[0x17] * 0x210);
    *(void **)(in_RDI + 0x18) = pvVar3;
    for (local_30 = 0;
        sVar2 = std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::size
                          ((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)(in_RSI + 1)),
        local_30 < sVar2; local_30 = local_30 + 1) {
      pvVar3 = (void *)(*(long *)(in_RDI + 0x18) + local_30 * 0x210);
      pvVar5 = std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::operator[]
                         ((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)(in_RSI + 1),
                          local_30);
      memcpy(pvVar3,pvVar5,0x100);
      lVar1 = *(long *)(in_RDI + 0x18);
      pvVar5 = std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::operator[]
                         ((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)(in_RSI + 1),
                          local_30);
      memcpy((void *)(lVar1 + local_30 * 0x210 + 0x100),pvVar5->type,0x100);
      pvVar5 = std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::operator[]
                         ((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)(in_RSI + 1),
                          local_30);
      *(int *)(*(long *)(in_RDI + 0x18) + local_30 * 0x210 + 0x208) = pvVar5->size;
      pvVar5 = std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::operator[]
                         ((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)(in_RSI + 1),
                          local_30);
      *(uchar **)(*(long *)(in_RDI + 0x18) + local_30 * 0x210 + 0x200) = pvVar5->value;
    }
  }
  in_RDI[0x16] = *(undefined4 *)
                  &in_RSI[5].
                   super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  return;
}

Assistant:

static void ConvertHeader(EXRHeader *exr_header, const HeaderInfo &info) {
  exr_header->pixel_aspect_ratio = info.pixel_aspect_ratio;
  exr_header->screen_window_center[0] = info.screen_window_center[0];
  exr_header->screen_window_center[1] = info.screen_window_center[1];
  exr_header->screen_window_width = info.screen_window_width;
  exr_header->chunk_count = info.chunk_count;
  exr_header->display_window.min_x = info.display_window.min_x;
  exr_header->display_window.min_y = info.display_window.min_y;
  exr_header->display_window.max_x = info.display_window.max_x;
  exr_header->display_window.max_y = info.display_window.max_y;
  exr_header->data_window.min_x = info.data_window.min_x;
  exr_header->data_window.min_y = info.data_window.min_y;
  exr_header->data_window.max_x = info.data_window.max_x;
  exr_header->data_window.max_y = info.data_window.max_y;
  exr_header->line_order = info.line_order;
  exr_header->compression_type = info.compression_type;

  exr_header->tile_size_x = info.tile_size_x;
  exr_header->tile_size_y = info.tile_size_y;
  exr_header->tile_level_mode = info.tile_level_mode;
  exr_header->tile_rounding_mode = info.tile_rounding_mode;

  exr_header->num_channels = static_cast<int>(info.channels.size());

  exr_header->channels = static_cast<EXRChannelInfo *>(malloc(
      sizeof(EXRChannelInfo) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
#ifdef _MSC_VER
    strncpy_s(exr_header->channels[c].name, info.channels[c].name.c_str(), 255);
#else
    strncpy(exr_header->channels[c].name, info.channels[c].name.c_str(), 255);
#endif
    // manually add '\0' for safety.
    exr_header->channels[c].name[255] = '\0';

    exr_header->channels[c].pixel_type = info.channels[c].pixel_type;
    exr_header->channels[c].p_linear = info.channels[c].p_linear;
    exr_header->channels[c].x_sampling = info.channels[c].x_sampling;
    exr_header->channels[c].y_sampling = info.channels[c].y_sampling;
  }

  exr_header->pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    exr_header->pixel_types[c] = info.channels[c].pixel_type;
  }

  // Initially fill with values of `pixel_types`
  exr_header->requested_pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    exr_header->requested_pixel_types[c] = info.channels[c].pixel_type;
  }

  exr_header->num_custom_attributes = static_cast<int>(info.attributes.size());

  if (exr_header->num_custom_attributes > 0) {
    // TODO(syoyo): Report warning when # of attributes exceeds
    // `TINYEXR_MAX_CUSTOM_ATTRIBUTES`
    if (exr_header->num_custom_attributes > TINYEXR_MAX_CUSTOM_ATTRIBUTES) {
      exr_header->num_custom_attributes = TINYEXR_MAX_CUSTOM_ATTRIBUTES;
    }

    exr_header->custom_attributes = static_cast<EXRAttribute *>(malloc(
        sizeof(EXRAttribute) * size_t(exr_header->num_custom_attributes)));

    for (size_t i = 0; i < info.attributes.size(); i++) {
      memcpy(exr_header->custom_attributes[i].name, info.attributes[i].name,
             256);
      memcpy(exr_header->custom_attributes[i].type, info.attributes[i].type,
             256);
      exr_header->custom_attributes[i].size = info.attributes[i].size;
      // Just copy pointer
      exr_header->custom_attributes[i].value = info.attributes[i].value;
    }

  } else {
    exr_header->custom_attributes = NULL;
  }

  exr_header->header_len = info.header_len;
}